

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O3

bool set_sigalg_prefs(Array<unsigned_short> *out,Span<const_unsigned_short> prefs)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_short *__src;
  long lVar6;
  Array<unsigned_short> sigalgs;
  Array<unsigned_short> local_48;
  
  uVar4 = prefs.size_;
  __src = prefs.data_;
  if (1 < uVar4) {
    local_48.data_ = (unsigned_short *)0x0;
    local_48.size_ = 0;
    bVar3 = bssl::Array<unsigned_short>::InitUninitialized(&local_48,uVar4);
    if (bVar3) {
      memmove(local_48.data_,__src,uVar4 * 2);
      puVar1 = local_48.data_;
      bVar3 = true;
      if (local_48.size_ != 0) {
        lVar6 = 0x3f;
        if (local_48.size_ != 0) {
          for (; local_48.size_ >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        std::__introsort_loop<unsigned_short*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_48.data_,local_48.data_ + local_48.size_,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>(puVar1);
        if (1 < local_48.size_) {
          uVar5 = 1;
          do {
            if (local_48.data_[uVar5 - 1] == local_48.data_[uVar5]) {
              ERR_put_error(0x10,0,0x128,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                            ,0x217);
              goto LAB_0015a007;
            }
            uVar5 = uVar5 + 1;
          } while (local_48.size_ != uVar5);
        }
      }
    }
    else {
LAB_0015a007:
      bVar3 = false;
    }
    OPENSSL_free(local_48.data_);
    if (!bVar3) {
      return false;
    }
  }
  local_48.data_ = (unsigned_short *)0x0;
  local_48.size_ = 0;
  bVar3 = bssl::Array<unsigned_short>::InitUninitialized(&local_48,uVar4);
  if (bVar3) {
    if (uVar4 == 0) {
      local_48.size_ = 0;
    }
    else {
      puVar1 = __src + uVar4;
      uVar4 = 0;
      do {
        uVar2 = *__src;
        if (uVar2 != 0xff01) {
          lVar6 = 0;
          while (*(unsigned_short *)((long)&bssl::kSignatureAlgorithms + lVar6) != uVar2) {
            lVar6 = lVar6 + 0x20;
            if (lVar6 == 0x1c0) {
              bVar3 = false;
              ERR_put_error(0x10,0,0x127,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                            ,0x233);
              goto LAB_0015a11d;
            }
          }
          if (local_48.size_ <= uVar4) goto LAB_0015a137;
          local_48.data_[uVar4] = uVar2;
          uVar4 = uVar4 + 1;
        }
        __src = __src + 1;
      } while (__src != puVar1);
      if (local_48.size_ < uVar4) {
LAB_0015a137:
        abort();
      }
      local_48.size_ = uVar4;
      if (uVar4 == 0) {
        bVar3 = false;
        ERR_put_error(0x10,0,0x127,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                      ,0x23f);
        goto LAB_0015a11d;
      }
    }
    OPENSSL_free(out->data_);
    out->data_ = local_48.data_;
    out->size_ = local_48.size_;
    local_48.data_ = (unsigned_short *)0x0;
    local_48.size_ = 0;
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
LAB_0015a11d:
  OPENSSL_free(local_48.data_);
  return bVar3;
}

Assistant:

static bool set_sigalg_prefs(Array<uint16_t> *out, Span<const uint16_t> prefs) {
  if (!sigalgs_unique(prefs)) {
    return false;
  }

  // Check for invalid algorithms, and filter out |SSL_SIGN_RSA_PKCS1_MD5_SHA1|.
  Array<uint16_t> filtered;
  if (!filtered.InitForOverwrite(prefs.size())) {
    return false;
  }
  size_t added = 0;
  for (uint16_t pref : prefs) {
    if (pref == SSL_SIGN_RSA_PKCS1_MD5_SHA1) {
      // Though not intended to be used with this API, we treat
      // |SSL_SIGN_RSA_PKCS1_MD5_SHA1| as a real signature algorithm in
      // |SSL_PRIVATE_KEY_METHOD|. Not accepting it here makes for a confusing
      // abstraction.
      continue;
    }
    if (get_signature_algorithm(pref) == nullptr) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
      return false;
    }
    filtered[added] = pref;
    added++;
  }
  filtered.Shrink(added);

  // This can happen if |prefs| contained only |SSL_SIGN_RSA_PKCS1_MD5_SHA1|.
  // Leaving it empty would revert to the default, so treat this as an error
  // condition.
  if (!prefs.empty() && filtered.empty()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
    return false;
  }

  *out = std::move(filtered);
  return true;
}